

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_async_generator_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  JSValue obj_00;
  JSValue ctor;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion *opaque;
  undefined8 in_RDX;
  JSContext *in_RSI;
  undefined8 in_R8;
  undefined4 in_R9D;
  JSValue JVar4;
  JSValueUnion unaff_retaddr;
  JSContext *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  JSAsyncGeneratorData *s;
  JSValue func_ret;
  JSValue obj;
  JSValue in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff88;
  JSAsyncFunctionState *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff4;
  JSContext *in_stack_fffffffffffffff8;
  int64_t iVar6;
  
  iVar3 = (int)((ulong)in_R8 >> 0x20);
  opaque = (JSValueUnion *)js_mallocz(in_stack_ffffffffffffff88,in_stack_ffffffffffffff78.tag);
  if (opaque == (JSValueUnion *)0x0) {
    uVar5 = 0;
    iVar6 = 6;
  }
  else {
    opaque[1].int32 = 0;
    init_list_head((list_head *)(opaque + 0xf));
    JVar4.tag = (int64_t)in_stack_00000008;
    JVar4.u.float64 = unaff_retaddr.float64;
    iVar2 = async_func_init(in_stack_fffffffffffffff8,
                            (JSAsyncFunctionState *)
                            CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                            (JSValue)in_stack_00000010,JVar4,(int)s,(JSValue *)func_ret.u.ptr);
    if (iVar2 == 0) {
      JVar4 = async_func_resume((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
      iVar2 = JS_IsException(JVar4);
      if (iVar2 == 0) {
        JS_FreeValue(in_stack_00000008,in_stack_ffffffffffffff78);
        ctor.tag._0_4_ = in_stack_fffffffffffffff0;
        ctor.u = (JSValueUnion)in_RDX;
        ctor.tag._4_4_ = in_stack_fffffffffffffff4;
        JVar4 = js_create_from_ctor(in_RSI,ctor,iVar3);
        iVar6 = JVar4.tag;
        in_stack_ffffffffffffff78 = JVar4;
        iVar3 = JS_IsException(JVar4);
        if (iVar3 == 0) {
          opaque->ptr = (void *)JVar4.u;
          obj_00.tag = iVar6;
          obj_00.u.float64 = JVar4.u.float64;
          JS_SetOpaque(obj_00,opaque);
          uVar5 = JVar4.u._0_4_;
          in_stack_fffffffffffffff4 = JVar4.u._4_4_;
          goto LAB_0014cb94;
        }
      }
    }
    else {
      opaque[1].int32 = 5;
    }
    js_async_generator_free
              ((JSRuntime *)in_stack_ffffffffffffff78.tag,
               (JSAsyncGeneratorData *)in_stack_ffffffffffffff78.u.ptr);
    uVar5 = 0;
    iVar6 = 6;
  }
LAB_0014cb94:
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar5;
  JVar1.tag = iVar6;
  return JVar1;
}

Assistant:

static JSValue js_async_generator_function_call(JSContext *ctx, JSValueConst func_obj,
                                                JSValueConst this_obj,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSValue obj, func_ret;
    JSAsyncGeneratorData *s;

    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        return JS_EXCEPTION;
    s->state = JS_ASYNC_GENERATOR_STATE_SUSPENDED_START;
    init_list_head(&s->queue);
    if (async_func_init(ctx, &s->func_state, func_obj, this_obj, argc, argv)) {
        s->state = JS_ASYNC_GENERATOR_STATE_COMPLETED;
        goto fail;
    }

    /* execute the function up to 'OP_initial_yield' (no yield nor
       await are possible) */
    func_ret = async_func_resume(ctx, &s->func_state);
    if (JS_IsException(func_ret))
        goto fail;
    JS_FreeValue(ctx, func_ret);

    obj = js_create_from_ctor(ctx, func_obj, JS_CLASS_ASYNC_GENERATOR);
    if (JS_IsException(obj))
        goto fail;
    s->generator = JS_VALUE_GET_OBJ(obj);
    JS_SetOpaque(obj, s);
    return obj;
 fail:
    js_async_generator_free(ctx->rt, s);
    return JS_EXCEPTION;
}